

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
          (SACSubcaseBase *this,char *src_vs,char *src_tcs,char *src_tes,char *src_gs,char *src_fs,
          bool link)

{
  GLuint program;
  GLuint GVar1;
  GLuint sh_4;
  GLuint sh_3;
  GLuint sh_2;
  GLuint sh_1;
  GLuint sh;
  GLuint p;
  bool link_local;
  char *src_fs_local;
  char *src_gs_local;
  char *src_tes_local;
  char *src_tcs_local;
  char *src_vs_local;
  SACSubcaseBase *this_local;
  
  _p = src_fs;
  src_fs_local = src_gs;
  src_gs_local = src_tes;
  src_tes_local = src_tcs;
  src_tcs_local = src_vs;
  src_vs_local = (char *)this;
  program = glu::CallLogWrapper::glCreateProgram
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper);
  if (src_tcs_local != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8b31);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar1);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,1,
               &src_tcs_local,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
  }
  if (src_tes_local != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8e88);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar1);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,1,
               &src_tes_local,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
  }
  if (src_gs_local != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8e87);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar1);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,1,&src_gs_local
               ,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
  }
  if (src_fs_local != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8dd9);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar1);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,1,&src_fs_local
               ,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
  }
  if (_p != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8b30);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar1);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,1,(GLchar **)&p
               ,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
  }
  if (link) {
    LinkProgram(this,program);
  }
  return program;
}

Assistant:

GLuint CreateProgram(const char* src_vs, const char* src_tcs, const char* src_tes, const char* src_gs,
						 const char* src_fs, bool link)
	{
		const GLuint p = glCreateProgram();

		if (src_vs)
		{
			GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_vs, NULL);
			glCompileShader(sh);
		}
		if (src_tcs)
		{
			GLuint sh = glCreateShader(GL_TESS_CONTROL_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tcs, NULL);
			glCompileShader(sh);
		}
		if (src_tes)
		{
			GLuint sh = glCreateShader(GL_TESS_EVALUATION_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tes, NULL);
			glCompileShader(sh);
		}
		if (src_gs)
		{
			GLuint sh = glCreateShader(GL_GEOMETRY_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_gs, NULL);
			glCompileShader(sh);
		}
		if (src_fs)
		{
			GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_fs, NULL);
			glCompileShader(sh);
		}
		if (link)
		{
			LinkProgram(p);
		}
		return p;
	}